

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::Data
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,
          Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *other)

{
  Entry *pEVar1;
  uchar *puVar2;
  Span *pSVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  long in_FS_OFFSET;
  R RVar14;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar12 = other->numBuckets;
  sVar13 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar13;
  this->spans = (Span *)0x0;
  RVar14 = allocateSpans(sVar12);
  this->spans = (Span *)RVar14.spans;
  lVar11 = 0;
  for (sVar12 = 0; sVar12 != RVar14.nSpans; sVar12 = sVar12 + 1) {
    pSVar3 = other->spans;
    for (sVar13 = 0; sVar13 != 0x80; sVar13 = sVar13 + 1) {
      uVar9 = (ulong)pSVar3->offsets[sVar13 + lVar11];
      if (uVar9 != 0xff) {
        pEVar4 = pSVar3[sVar12].entries;
        local_48.span = this->spans + sVar12;
        local_48.index = sVar13;
        pNVar10 = Bucket::insert(&local_48);
        pEVar1 = pEVar4 + uVar9;
        uVar5 = *(undefined8 *)(pEVar1->storage).data;
        uVar6 = *(undefined8 *)((pEVar1->storage).data + 8);
        puVar2 = pEVar4[uVar9].storage.data + 0xc;
        uVar7 = *(undefined8 *)puVar2;
        uVar8 = *(undefined8 *)(puVar2 + 8);
        pNVar10->key = (int)uVar5;
        (pNVar10->value).trackingId = (int)((ulong)uVar5 >> 0x20);
        (pNVar10->value).x = (int)uVar6;
        (pNVar10->value).y = (int)((ulong)uVar6 >> 0x20);
        (pNVar10->value).y = (int)uVar7;
        (pNVar10->value).maj = (int)((ulong)uVar7 >> 0x20);
        (pNVar10->value).pressure = (int)uVar8;
        (pNVar10->value).state = (char)((ulong)uVar8 >> 0x20);
        *(int3 *)&(pNVar10->value).field_0x15 = (int3)((ulong)uVar8 >> 0x28);
      }
    }
    lVar11 = lVar11 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }